

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotate_(rotating_file_sink<std::mutex> *this)

{
  bool bVar1;
  int *piVar2;
  int in_ESI;
  file_helper *this_00;
  size_t index;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  filename_t target;
  filename_t src;
  
  this_00 = &this->file_helper_;
  details::file_helper::close(this_00,in_ESI);
  index = this->max_files_;
  do {
    if (index == 0) {
      details::file_helper::reopen(this_00,true);
      return;
    }
    calc_filename(&src,&this->base_filename_,index - 1);
    bVar1 = details::os::path_exists(&src);
    if (bVar1) {
      calc_filename(&target,&this->base_filename_,index);
      bVar1 = rename_file_(this,&src,&target);
      if (!bVar1) {
        details::os::sleep_for_millis(100);
        bVar1 = rename_file_(this,&src,&target);
        if (!bVar1) {
          details::file_helper::reopen(this_00,true);
          this->current_size_ = 0;
          details::os::filename_to_str(&local_f0,&src);
          std::operator+(&local_d0,"rotating_file_sink: failed renaming ",&local_f0);
          std::operator+(&local_b0,&local_d0," to ");
          details::os::filename_to_str(&local_110,&target);
          std::operator+(&local_90,&local_b0,&local_110);
          piVar2 = __errno_location();
          throw_spdlog_ex(&local_90,*piVar2);
        }
      }
      std::__cxx11::string::~string((string *)&target);
    }
    std::__cxx11::string::~string((string *)&src);
    index = index - 1;
  } while( true );
}

Assistant:

SPDLOG_INLINE void rotating_file_sink<Mutex>::rotate_() {
    using details::os::filename_to_str;
    using details::os::path_exists;

    file_helper_.close();
    for (auto i = max_files_; i > 0; --i) {
        filename_t src = calc_filename(base_filename_, i - 1);
        if (!path_exists(src)) {
            continue;
        }
        filename_t target = calc_filename(base_filename_, i);

        if (!rename_file_(src, target)) {
            // if failed try again after a small delay.
            // this is a workaround to a windows issue, where very high rotation
            // rates can cause the rename to fail with permission denied (because of antivirus?).
            details::os::sleep_for_millis(100);
            if (!rename_file_(src, target)) {
                file_helper_.reopen(
                    true);  // truncate the log file anyway to prevent it to grow beyond its limit!
                current_size_ = 0;
                throw_spdlog_ex("rotating_file_sink: failed renaming " + filename_to_str(src) +
                                    " to " + filename_to_str(target),
                                errno);
            }
        }
    }
    file_helper_.reopen(true);
}